

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  Expression **ppEVar1;
  
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xeb5,
                  "BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < *(ulong *)(expr + 5)) {
    ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         &expr[4].type,(ulong)index);
    return *ppEVar1;
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchBodies.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xeb6,
                "BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef expr,
                                                BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchBodies.size());
  return static_cast<Try*>(expression)->catchBodies[index];
}